

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::runInvariants
          (Interpreter *this,LocationRange *loc,HeapObject *self)

{
  uint *puVar1;
  Frame *this_00;
  pointer pcVar2;
  pointer ppHVar3;
  HeapThunk *context;
  bool bVar4;
  pointer pFVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  LocationRange *args_1;
  uint initial_stack_size;
  bool bVar9;
  uint counter;
  uint local_74;
  long *local_70 [2];
  long local_60 [2];
  unsigned_long local_50;
  unsigned_long uStack_48;
  unsigned_long local_40;
  unsigned_long uStack_38;
  
  pFVar5 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  initial_stack_size =
       (int)((ulong)((long)(this->stack).stack.
                           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5) >> 4) *
       -0x3d70a3d7;
  uVar6 = initial_stack_size - 1;
  bVar9 = -1 < (int)uVar6;
  if (bVar9) {
    pFVar5 = pFVar5 + uVar6;
    bVar9 = true;
    lVar7 = (ulong)uVar6 + 1;
    do {
      if ((pFVar5->kind == FRAME_INVARIANTS) && (pFVar5->self == self)) break;
      pFVar5 = pFVar5 + -1;
      bVar9 = lVar7 != 1 && -1 < lVar7 + -1;
      lVar8 = lVar7 + -1;
      bVar4 = 0 < lVar7;
      lVar7 = lVar8;
    } while (lVar8 != 0 && bVar4);
  }
  if (!bVar9) {
    local_74 = 0;
    local_70[0] = local_60;
    pcVar2 = (loc->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + (loc->file)._M_string_length);
    local_50 = (loc->begin).line;
    uStack_48 = (loc->begin).column;
    local_40 = (loc->end).line;
    uStack_38 = (loc->end).column;
    (anonymous_namespace)::Stack::
    newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::LocationRange>
              ((Stack *)&this->stack,(FrameKind)(string *)local_70,args_1);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    pFVar5 = (this->stack).stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    objectInvariants(this,self,self,&local_74,&pFVar5[-1].thunks);
    ppHVar3 = pFVar5[-1].thunks.
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pFVar5[-1].thunks.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppHVar3) {
      pFVar5 = (this->stack).stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = pFVar5 + -1;
      if (pFVar5[-1].kind == FRAME_CALL) {
        puVar1 = &(this->stack).calls;
        *puVar1 = *puVar1 - 1;
      }
      (this->stack).stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = this_00;
      Frame::~Frame(this_00);
    }
    else {
      context = *ppHVar3;
      pFVar5 = (this->stack).stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar5[-1].elementId = 1;
      pFVar5[-1].self = self;
      Stack::newCall(&this->stack,loc,&context->super_HeapEntity,context->self,context->offset,
                     &context->upValues);
      evaluate(this,context->body,initial_stack_size);
    }
  }
  return;
}

Assistant:

void runInvariants(const LocationRange &loc, HeapObject *self)
    {
        if (stack.alreadyExecutingInvariants(self))
            return;

        unsigned counter = 0;
        unsigned initial_stack_size = stack.size();
        stack.newFrame(FRAME_INVARIANTS, loc);
        std::vector<HeapThunk *> &thunks = stack.top().thunks;
        objectInvariants(self, self, counter, thunks);
        if (thunks.size() == 0) {
            stack.pop();
            return;
        }
        HeapThunk *thunk = thunks[0];
        stack.top().elementId = 1;
        stack.top().self = self;
        stack.newCall(loc, thunk, thunk->self, thunk->offset, thunk->upValues);
        evaluate(thunk->body, initial_stack_size);
    }